

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall Timer::clockHandler(Timer *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  __time_t _Var3;
  bool bVar4;
  long lVar5;
  __time_t _Var6;
  long lVar7;
  timeval tv;
  AutoLock l;
  Condition c;
  Mutex m;
  timeval local_d8;
  AutoLock local_c8;
  Condition local_b0;
  Mutex local_80;
  
  Condition::Condition(&local_b0);
  Mutex::Mutex(&local_80,false);
  AutoLock::AutoLock(&local_c8,&local_80);
  gettimeofday(&local_d8,(__timezone_ptr_t)0x0);
  if (this->mClockThread->mStop == false) {
    lVar7 = local_d8.tv_usec * 1000;
    _Var6 = local_d8.tv_sec;
    do {
      bVar4 = Condition::Wait(&local_b0,&local_80,this->mMsPerTick);
      if (bVar4) {
        jh_log_print(1,"void Timer::clockHandler()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0xb2,"Signal recieved on timer condition????\n");
      }
      else {
        gettimeofday(&local_d8,(__timezone_ptr_t)0x0);
        _Var3 = local_d8.tv_sec;
        lVar5 = local_d8.tv_usec * 1000;
        auVar2 = SEXT816(lVar5 - lVar7) * SEXT816(0x431bde82d7b634db);
        if ((uint)((int)((ulong)((local_d8.tv_sec - _Var6) * 0x3e800000000) >> 0x20) +
                  ((int)(auVar2._8_8_ >> 0x12) - (auVar2._12_4_ >> 0x1f))) < 0x2711) {
          while (auVar2 = SEXT816(lVar5 - lVar7) * SEXT816(0x431bde82d7b634db),
                iVar1 = this->mMsPerTick,
                iVar1 < (int)((ulong)((_Var3 - _Var6) * 0x3e800000000) >> 0x20) +
                        ((int)(auVar2._8_8_ >> 0x12) - (auVar2._12_4_ >> 0x1f))) {
            _Var6 = _Var6 + iVar1 / 1000;
            lVar7 = lVar7 + (iVar1 % 1000) * 1000000;
            if (lVar7 < 1000000000) {
              if (lVar7 < 0) {
                _Var6 = _Var6 + -1;
                lVar7 = lVar7 + 1000000000;
              }
            }
            else {
              _Var6 = _Var6 + 1;
              lVar7 = lVar7 + -1000000000;
            }
            handleTick(this);
          }
        }
        else {
          gettimeofday(&local_d8,(__timezone_ptr_t)0x0);
          _Var6 = local_d8.tv_sec;
          lVar7 = local_d8.tv_usec * 1000;
          handleTick(this);
        }
      }
    } while (this->mClockThread->mStop != true);
  }
  AutoLock::~AutoLock(&local_c8);
  Mutex::~Mutex(&local_80);
  Condition::~Condition(&local_b0);
  return;
}

Assistant:

void Timer::clockHandler()
{
	TRACE_BEGIN( LOG_LVL_INFO );	
	struct timespec start, cur;
	Condition c;
	Mutex m;
	AutoLock l(m);
	
	TimeUtils::getCurTime( &start );
	while ( !mClockThread->CheckStop() )
	{	
		// Wait for the tick to timeout
		if (not c.Wait(m, mMsPerTick))
		{
			TimeUtils::getCurTime( &cur );
			
			// Check to see if the clock was set back, or jumps
			// forward by more than 10 seconds. If so, update the
			// starting time to the current time and wait for the next
			// tick.
			if ( TimeUtils::getDifference( &cur, &start ) < 0 or
				 TimeUtils::getDifference( &cur, &start ) > 10000 )
			{
				TimeUtils::getCurTime( &start );
				handleTick();
			}
			else
			{	
				// Get the current time and count ticks until cur time and the 
				// actual tick time are less the mMsPerTick apart.
				while ( TimeUtils::getDifference( &cur, &start ) > mMsPerTick )
				{
					TimeUtils::addOffset( &start, mMsPerTick );
					handleTick();
				}
			}
		}
		else
		{
			LOG_ERR_FATAL("Signal recieved on timer condition????\n");
		}
	}
}